

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osstzprs.c
# Opt level: O0

char * parse_digits(int *val,char *p,size_t *len)

{
  ushort **ppuVar1;
  long *in_RDX;
  char *in_RSI;
  int *in_RDI;
  bool bVar2;
  char *local_10;
  
  *in_RDI = 0;
  local_10 = in_RSI;
  while( true ) {
    bVar2 = false;
    if (*in_RDX != 0) {
      ppuVar1 = __ctype_b_loc();
      bVar2 = ((*ppuVar1)[(int)*local_10] & 0x800) != 0;
    }
    if (!bVar2) break;
    *in_RDI = *in_RDI * 10;
    *in_RDI = *local_10 + -0x30 + *in_RDI;
    local_10 = local_10 + 1;
    *in_RDX = *in_RDX + -1;
  }
  return local_10;
}

Assistant:

static const char *parse_digits(int *val, const char *p, size_t *len)
{
    for (*val = 0 ; *len != 0 && isdigit(*p) ; ++p, --*len)
    {
        *val *= 10;
        *val += *p - '0';
    }
    return p;
}